

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

bool __thiscall SGParser::Generator::Lex::MakeDFAUsingNFA(Lex *this,DFAGen *dfa)

{
  uint uVar1;
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *pvVar2;
  ulong uVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  pointer ppVar7;
  mapped_type *ppNVar8;
  reference pvVar9;
  NFA *pNVar10;
  reference pvVar11;
  undefined8 uVar12;
  reference ppNVar13;
  size_t sVar14;
  reference __in;
  type *ppNVar15;
  type *nfa_2;
  type *_;
  _Self local_218;
  iterator __end2_1;
  iterator __begin2_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  *__range2_1;
  NFA *nfa_1;
  iterator __end3;
  iterator __begin3;
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *__range3;
  NFA combinedNFA;
  NFA *nfa;
  iterator __end5;
  iterator __begin5;
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *__range5;
  NFA *pnfa_1;
  uint j;
  uint EndLexeme;
  size_t i;
  DFAGen dfa2;
  vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> lexemeNFAList;
  NFA *pnfa;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *regExp;
  _Self local_78;
  iterator iter;
  String *name;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  macroNFAs;
  DFAGen *dfa_local;
  Lex *this_local;
  
  macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)dfa;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
         *)&__range2);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->MacroNames);
  sVar6 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::size(&this->Macros);
  if (sVar5 != sVar6) {
    __assert_fail("MacroNames.size() == Macros.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                  ,0x41e,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
  }
  __end2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->MacroNames);
  name = (String *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->MacroNames);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&name), bVar4) {
    iter._M_node = (_Base_ptr)
                   __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end2);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find(&this->Macros,(key_type *)iter._M_node);
    regExp = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end(&this->Macros);
    bVar4 = std::operator!=(&local_78,(_Self *)&regExp);
    if (!bVar4) {
      __assert_fail("iter != Macros.end()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Parser-Builder-Org[P]SGParser/src/ParserGen/Lex.cpp"
                    ,0x421,"bool SGParser::Generator::Lex::MakeDFAUsingNFA(DFAGen &)");
    }
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_78);
    pNVar10 = (NFA *)operator_new(0x28);
    NFA::NFA(pNVar10);
    bVar4 = MakeNFA(this,pNVar10,&ppVar7->second,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                     *)&__range2);
    if (bVar4) {
      ppNVar8 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                              *)&__range2,(key_type *)iter._M_node);
      *ppNVar8 = pNVar10;
    }
    else if (pNVar10 != (NFA *)0x0) {
      NFA::~NFA(pNVar10);
      operator_delete(pNVar10,0x28);
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end2);
  }
  sVar5 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::size(&this->Lexemes);
  if ((sVar5 != 0) &&
     (sVar5 = std::
              vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
              ::size(&this->Expressions), sVar5 == 0)) {
    lexemeNFAList.
    super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    sVar5 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::size(&this->Lexemes);
    lexemeNFAList.
    super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)sVar5;
    std::
    vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
    ::push_back(&this->Expressions,
                (value_type *)
                &lexemeNFAList.
                 super__Vector_base<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::vector
            ((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)
             &dfa2.EmptyStateCount);
  DFAGen::DFAGen((DFAGen *)&i);
  for (_j = 0; uVar3 = _j,
      sVar5 = std::
              vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
              ::size(&this->Expressions), uVar3 < sVar5; _j = _j + 1) {
    pvVar9 = std::
             vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
             ::operator[](&this->Expressions,_j);
    uVar1 = pvVar9->StartLexeme;
    pvVar9 = std::
             vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
             ::operator[](&this->Expressions,_j);
    pnfa_1._4_4_ = uVar1 + pvVar9->LexemeCount;
    pvVar9 = std::
             vector<SGParser::Generator::Lex::Expression,_std::allocator<SGParser::Generator::Lex::Expression>_>
             ::operator[](&this->Expressions,_j);
    for (pnfa_1._0_4_ = pvVar9->StartLexeme; (uint)pnfa_1 < pnfa_1._4_4_;
        pnfa_1._0_4_ = (uint)pnfa_1 + 1) {
      pNVar10 = (NFA *)operator_new(0x28);
      NFA::NFA(pNVar10,(uint)pnfa_1 + 2);
      __range5 = (vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)
                 pNVar10;
      pvVar11 = std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::operator[]
                          (&this->Lexemes,(ulong)(uint)pnfa_1);
      bVar4 = MakeNFA(this,pNVar10,&pvVar11->RegularExpression,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                       *)&__range2);
      if (!bVar4) {
        std::vector<SGParser::Lexeme,_std::allocator<SGParser::Lexeme>_>::operator[]
                  (&this->Lexemes,(ulong)(uint)pnfa_1);
        uVar12 = std::__cxx11::string::data();
        CheckForErrorAndReport(this,"Failed to make an NFA from the \'%s\' expression.",uVar12);
        pvVar2 = __range5;
        if (__range5 !=
            (vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)0x0)
        {
          NFA::~NFA((NFA *)__range5);
          operator_delete(pvVar2,0x28);
        }
        __end5 = std::
                 vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
                 begin((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                        *)&dfa2.EmptyStateCount);
        nfa = (NFA *)std::
                     vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                     ::end((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                            *)&dfa2.EmptyStateCount);
        while (bVar4 = __gnu_cxx::operator!=
                                 (&__end5,(__normal_iterator<SGParser::Generator::NFA_**,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
                                           *)&nfa), bVar4) {
          ppNVar13 = __gnu_cxx::
                     __normal_iterator<SGParser::Generator::NFA_**,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
                     ::operator*(&__end5);
          pNVar10 = *ppNVar13;
          if (pNVar10 != (NFA *)0x0) {
            NFA::~NFA(pNVar10);
            operator_delete(pNVar10,0x28);
          }
          __gnu_cxx::
          __normal_iterator<SGParser::Generator::NFA_**,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
          ::operator++(&__end5);
        }
        this_local._7_1_ = 0;
        combinedNFA.FinalState.
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        goto LAB_0018ddb3;
      }
      std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
      push_back((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)
                &dfa2.EmptyStateCount,(value_type *)&__range5);
    }
    NFA::NFA((NFA *)&__range3,1);
    NFA::CombineNFAs((NFA *)&__range3,
                     (vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                      *)&dfa2.EmptyStateCount);
    __end3 = std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
             begin((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                    *)&dfa2.EmptyStateCount);
    nfa_1 = (NFA *)std::
                   vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::
                   end((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>
                        *)&dfa2.EmptyStateCount);
    while (bVar4 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<SGParser::Generator::NFA_**,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
                                       *)&nfa_1), bVar4) {
      ppNVar13 = __gnu_cxx::
                 __normal_iterator<SGParser::Generator::NFA_**,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
                 ::operator*(&__end3);
      pNVar10 = *ppNVar13;
      if (pNVar10 != (NFA *)0x0) {
        NFA::~NFA(pNVar10);
        operator_delete(pNVar10,0x28);
      }
      __gnu_cxx::
      __normal_iterator<SGParser::Generator::NFA_**,_std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>_>
      ::operator++(&__end3);
    }
    std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::clear
              ((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)
               &dfa2.EmptyStateCount);
    if (_j == 0) {
      DFAGen::Create((DFAGen *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (NFA *)&__range3,&this->Lexemes,0x100);
LAB_0018dc99:
      combinedNFA.FinalState.
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
    }
    else {
      sVar14 = DFA::GetCharCount((DFA *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      DFAGen::Create((DFAGen *)&i,(NFA *)&__range3,&this->Lexemes,(int)sVar14 - 1);
      bVar4 = DFAGen::Combine((DFAGen *)macroNFAs._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (DFAGen *)&i);
      if (bVar4) goto LAB_0018dc99;
      CheckForErrorAndReport(this,"Failed to combine DFAs.");
      this_local._7_1_ = 0;
      combinedNFA.FinalState.
      super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
    }
    NFA::~NFA((NFA *)&__range3);
    if (combinedNFA.FinalState.
        super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_0018ddb3;
  }
  __end2_1 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
                      *)&__range2);
  local_218._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
              *)&__range2);
  while (bVar4 = std::operator!=(&__end2_1,&local_218), bVar4) {
    __in = std::
           _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>
           ::operator*(&__end2_1);
    std::get<0ul,std::__cxx11::string_const,SGParser::Generator::NFA*>(__in);
    ppNVar15 = std::get<1ul,std::__cxx11::string_const,SGParser::Generator::NFA*>(__in);
    pNVar10 = *ppNVar15;
    if (pNVar10 != (NFA *)0x0) {
      NFA::~NFA(pNVar10);
      operator_delete(pNVar10,0x28);
    }
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>
    ::operator++(&__end2_1);
  }
  this_local._7_1_ = 1;
  combinedNFA.FinalState.
  super__Vector_base<SGParser::Generator::NFANode_*,_std::allocator<SGParser::Generator::NFANode_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
LAB_0018ddb3:
  DFAGen::~DFAGen((DFAGen *)&i);
  std::vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_>::~vector
            ((vector<SGParser::Generator::NFA_*,_std::allocator<SGParser::Generator::NFA_*>_> *)
             &dfa2.EmptyStateCount);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_SGParser::Generator::NFA_*>_>_>
          *)&__range2);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Lex::MakeDFAUsingNFA(DFAGen& dfa) {
    // Store the macro NFAs
    std::map<String, NFA*> macroNFAs;

    // Go through all macros (in declaration-order) and create NFA's for them.
    // ("In declaration-order" so a lexically-later macro can refer to a lexically-earlier macro.)
    SG_ASSERT(MacroNames.size() == Macros.size());
    for (const String& name : MacroNames) {
        auto const iter = Macros.find(name);
        SG_ASSERT(iter != Macros.end());
        auto const& regExp = iter->second;

        // Create a new nfa to be filled
        const auto pnfa = new NFA;

        // if the nfa failed to initialize then quite
        if (MakeNFA(*pnfa, regExp, macroNFAs))
            macroNFAs[name] = pnfa;
        else
            delete pnfa; // Should we report an error?
    }

    // If there are lexemes, but not a single expression
    // make an expression for them (special case)
    if (Lexemes.size() && !Expressions.size())
        Expressions.push_back({0u, unsigned(Lexemes.size())});

    // Go through all expression lexemes and construct a list of DFA
    std::vector<NFA*> lexemeNFAList;
    DFAGen            dfa2;

    for (size_t i = 0u; i < Expressions.size(); ++i) {
        // Store NFAs for this expression
        const auto EndLexeme = Expressions[i].StartLexeme + Expressions[i].LexemeCount;
        for (unsigned j = Expressions[i].StartLexeme; j < EndLexeme; ++j) {
            const auto pnfa = new NFA{j + TokenCode::TokenFirstID};

            // if the nfa failed to initialize then quit
            if (!MakeNFA(*pnfa, Lexemes[j].RegularExpression, macroNFAs)) {
                // ERROR: Making an NFA from RE failed, probably syntax error in RE
                CheckForErrorAndReport("Failed to make an NFA from the '%s' expression.",
                                       Lexemes[j].RegularExpression.data());

                // This seems to be necessary here in case of error
                delete pnfa;
                for (const auto nfa : lexemeNFAList)
                    delete nfa;

                return false;
            }

            lexemeNFAList.push_back(pnfa);
        }

        // Combine all the individual NFAs into one
        NFA combinedNFA{1u};
        combinedNFA.CombineNFAs(lexemeNFAList);

        for (const auto nfa: lexemeNFAList)
            delete nfa;
        lexemeNFAList.clear();

        // Make a DFA from the huge NFA
        // Should really have a more complex character-counting scheme!
        if (i == 0u)
            dfa.Create(combinedNFA, Lexemes, 256u);
        else {
            // And combine it to form an expression
            dfa2.Create(combinedNFA, Lexemes, unsigned(dfa.GetCharCount() - 1u));
            if (!dfa.Combine(dfa2)) {
                // ERROR: Failed to combine DFAs, probably inconsistent states
                CheckForErrorAndReport("Failed to combine DFAs.");
                return false;
            }
        }
    }

    // Free all the macro NFA's
    for (const auto& [_, nfa] : macroNFAs)
        delete nfa;

    return true;
}